

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O3

uint __thiscall
QFragmentMapData<QTextFragmentData>::erase_single(QFragmentMapData<QTextFragmentData> *this,uint z)

{
  int *piVar1;
  quint32 *pqVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint *puVar10;
  long lVar11;
  Header *pHVar12;
  ulong uVar13;
  uint x;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  quint32 qVar18;
  
  uVar9 = (ulong)z;
  uVar6 = previous(this,z);
  pHVar12 = (this->field_0).head;
  lVar7 = uVar9 * 0x20;
  puVar10 = (uint *)((long)pHVar12 + lVar7 + 8);
  uVar8 = (ulong)*(uint *)((long)pHVar12 + lVar7 + 4);
  if (uVar8 == 0) {
LAB_004d65cf:
    uVar13 = (ulong)*puVar10;
  }
  else {
    uVar3 = *puVar10;
    if (*puVar10 == 0) {
      puVar10 = (uint *)((long)pHVar12 + lVar7 + 4);
      goto LAB_004d65cf;
    }
    do {
      uVar15 = uVar3;
      lVar11 = (ulong)uVar15 * 0x20;
      uVar3 = *(uint *)((long)pHVar12 + lVar11 + 4);
    } while (uVar3 != 0);
    uVar3 = *(uint *)((long)pHVar12 + lVar11 + 8);
    uVar13 = (ulong)uVar3;
    if (uVar15 != z) {
      *(uint *)((long)pHVar12 + uVar8 * 0x20) = uVar15;
      *(undefined4 *)((long)(this->field_0).head + lVar11 + 4) =
           *(undefined4 *)((long)(this->field_0).head + lVar7 + 4);
      *(undefined4 *)((long)(this->field_0).head + lVar11 + 0x10) =
           *(undefined4 *)((long)(this->field_0).head + lVar7 + 0x10);
      pHVar12 = (this->field_0).head;
      if (uVar15 == *(uint *)((long)pHVar12 + lVar7 + 8)) {
LAB_004d65c3:
        uVar8 = (ulong)uVar15;
      }
      else {
        uVar4 = *(uint *)((long)pHVar12 + lVar11);
        uVar8 = (ulong)uVar4;
        if (uVar3 != 0) {
          *(uint *)((long)pHVar12 + uVar13 * 0x20) = uVar4;
          pHVar12 = (this->field_0).head;
        }
        *(uint *)((long)pHVar12 + uVar8 * 0x20 + 4) = uVar3;
        *(undefined4 *)((long)(this->field_0).head + lVar11 + 8) =
             *(undefined4 *)((long)(this->field_0).head + lVar7 + 8);
        *(uint *)((long)(this->field_0).head +
                 (ulong)*(uint *)((long)(this->field_0).head + lVar7 + 8) * 0x20) = uVar15;
        pHVar12 = (this->field_0).head;
        uVar14 = uVar8;
        if (uVar4 == uVar15) goto LAB_004d65c3;
        do {
          piVar1 = (int *)((long)pHVar12 + uVar14 * 0x20 + 0x10);
          *piVar1 = *piVar1 - *(int *)((long)pHVar12 + lVar11 + 0x14);
          pHVar12 = (this->field_0).head;
          uVar3 = *(uint *)((long)pHVar12 + uVar14 * 0x20);
          uVar14 = (ulong)uVar3;
        } while (uVar3 != uVar15);
      }
      uVar3 = *(uint *)((long)pHVar12 + lVar7);
      uVar14 = (ulong)uVar3;
      if (uVar14 == 0) {
        pHVar12->root = uVar15;
      }
      else {
        lVar17 = uVar14 * 0x20;
        if (*(uint *)((long)pHVar12 + lVar17 + 4) == z) {
          *(uint *)((long)pHVar12 + lVar17 + 4) = uVar15;
          pqVar2 = (this->field_0).fragments[uVar14].super_QFragment<1>.size_left_array;
          *pqVar2 = *pqVar2 - (this->field_0).fragments[uVar9].super_QFragment<1>.size_array[0];
        }
        else {
          *(uint *)((long)pHVar12 + lVar17 + 8) = uVar15;
        }
      }
      *(uint *)((long)(this->field_0).head + lVar11) = uVar3;
      pHVar12 = (this->field_0).head;
      uVar5 = *(undefined4 *)((long)pHVar12 + lVar11 + 0xc);
      *(undefined4 *)((long)pHVar12 + lVar11 + 0xc) = *(undefined4 *)((long)pHVar12 + lVar7 + 0xc);
      *(undefined4 *)((long)(this->field_0).head + lVar7 + 0xc) = uVar5;
      goto LAB_004d6694;
    }
  }
  uVar3 = *(uint *)((long)pHVar12 + lVar7);
  uVar8 = (ulong)uVar3;
  qVar18 = (quint32)uVar13;
  if (qVar18 != 0) {
    *(uint *)((long)pHVar12 + uVar13 * 0x20) = uVar3;
  }
  pHVar12 = (this->field_0).head;
  if (uVar3 == 0) {
    pHVar12->root = qVar18;
    uVar8 = 0;
  }
  else {
    lVar11 = uVar8 * 0x20;
    if (*(uint *)((long)pHVar12 + lVar11 + 4) == z) {
      *(quint32 *)((long)pHVar12 + lVar11 + 4) = qVar18;
      pqVar2 = (this->field_0).fragments[uVar8].super_QFragment<1>.size_left_array;
      *pqVar2 = *pqVar2 - (this->field_0).fragments[uVar9].super_QFragment<1>.size_array[0];
    }
    else {
      *(quint32 *)((long)pHVar12 + lVar11 + 8) = qVar18;
    }
  }
LAB_004d6694:
  pHVar12 = (this->field_0).head;
  uVar3 = *(uint *)((long)pHVar12 + lVar7);
  while (uVar3 != 0) {
    uVar14 = (ulong)uVar3;
    lVar11 = (ulong)uVar3 * 0x20;
    if (*(int *)((long)pHVar12 + lVar11 + 4) == (int)uVar9) {
      piVar1 = (int *)((long)pHVar12 + lVar11 + 0x10);
      *piVar1 = *piVar1 - *(int *)((long)pHVar12 + lVar7 + 0x14);
      pHVar12 = (this->field_0).head;
    }
    uVar9 = uVar14;
    uVar3 = *(uint *)((long)pHVar12 + lVar11);
  }
  *(quint32 *)((long)pHVar12 + lVar7 + 8) = pHVar12->freelist;
  ((this->field_0).head)->freelist = z;
  pqVar2 = &((this->field_0).head)->node_count;
  *pqVar2 = *pqVar2 - 1;
  pHVar12 = (this->field_0).head;
  if (*(int *)((long)pHVar12 + lVar7 + 0xc) != 0) {
    if (*(int *)((long)pHVar12 + uVar13 * 0x20) != 0) {
      lVar7 = uVar13 * 0x20 + (long)pHVar12;
      do {
        uVar9 = uVar8;
        if (((uint)uVar13 != 0) && (*(int *)(lVar7 + 0xc) != 1)) goto LAB_004d6966;
        lVar11 = uVar9 * 0x20;
        uVar3 = *(uint *)((long)pHVar12 + lVar11 + 4);
        uVar8 = (ulong)uVar3;
        x = (uint)uVar9;
        if ((uint)uVar13 != uVar3) {
          if (*(int *)((long)pHVar12 + uVar8 * 0x20 + 0xc) == 0) {
            *(undefined4 *)((long)pHVar12 + uVar8 * 0x20 + 0xc) = 1;
            *(undefined4 *)((long)(this->field_0).head + lVar11 + 0xc) = 0;
            rotateRight(this,x);
            pHVar12 = (this->field_0).head;
            uVar8 = (ulong)*(uint *)((long)pHVar12 + lVar11 + 4);
          }
          lVar17 = uVar8 * 0x20;
          lVar7 = (long)pHVar12 + lVar17;
          uVar14 = (ulong)*(uint *)((long)pHVar12 + lVar17 + 8);
          if ((uVar14 == 0) || (*(int *)((long)pHVar12 + uVar14 * 0x20 + 0xc) == 1)) {
            uVar16 = (ulong)*(uint *)(lVar7 + 4);
            if ((uVar16 == 0) || (*(int *)((long)pHVar12 + uVar16 * 0x20 + 0xc) == 1))
            goto LAB_004d6821;
LAB_004d6854:
            if (*(int *)((long)pHVar12 + uVar16 * 0x20 + 0xc) == 1) {
              if (uVar14 != 0) goto LAB_004d6867;
              goto LAB_004d6876;
            }
          }
          else {
            uVar16 = (ulong)*(uint *)(lVar7 + 4);
            if (*(uint *)(lVar7 + 4) != 0) goto LAB_004d6854;
LAB_004d6867:
            *(undefined4 *)((long)pHVar12 + uVar14 * 0x20 + 0xc) = 1;
            pHVar12 = (this->field_0).head;
LAB_004d6876:
            *(undefined4 *)((long)pHVar12 + lVar17 + 0xc) = 0;
            rotateLeft(this,*(uint *)((long)(this->field_0).head + lVar11 + 4));
            pHVar12 = (this->field_0).head;
            uVar8 = (ulong)*(uint *)((long)pHVar12 + lVar11 + 4);
          }
          *(undefined4 *)((long)pHVar12 + uVar8 * 0x20 + 0xc) =
               *(undefined4 *)((long)pHVar12 + lVar11 + 0xc);
          *(undefined4 *)((long)(this->field_0).head + lVar11 + 0xc) = 1;
          uVar9 = (ulong)*(uint *)((long)(this->field_0).head + uVar8 * 0x20 + 4);
          if (uVar9 != 0) {
            *(undefined4 *)((long)(this->field_0).head + uVar9 * 0x20 + 0xc) = 1;
          }
          rotateRight(this,x);
          break;
        }
        uVar8 = (ulong)*(uint *)((long)pHVar12 + lVar11 + 8);
        if (*(int *)((long)pHVar12 + uVar8 * 0x20 + 0xc) == 0) {
          *(undefined4 *)((long)pHVar12 + uVar8 * 0x20 + 0xc) = 1;
          *(undefined4 *)((long)(this->field_0).head + lVar11 + 0xc) = 0;
          rotateLeft(this,x);
          pHVar12 = (this->field_0).head;
          uVar8 = (ulong)*(uint *)((long)pHVar12 + lVar11 + 8);
        }
        lVar17 = uVar8 * 0x20;
        lVar7 = (long)pHVar12 + lVar17;
        uVar14 = (ulong)*(uint *)((long)pHVar12 + lVar17 + 4);
        if ((uVar14 != 0) && (*(int *)((long)pHVar12 + uVar14 * 0x20 + 0xc) != 1)) {
          uVar16 = (ulong)*(uint *)(lVar7 + 8);
          if (*(uint *)(lVar7 + 8) != 0) goto LAB_004d68df;
LAB_004d68f2:
          *(undefined4 *)((long)pHVar12 + uVar14 * 0x20 + 0xc) = 1;
          pHVar12 = (this->field_0).head;
LAB_004d6901:
          *(undefined4 *)((long)pHVar12 + lVar17 + 0xc) = 0;
          rotateRight(this,*(uint *)((long)(this->field_0).head + lVar11 + 8));
          pHVar12 = (this->field_0).head;
          uVar8 = (ulong)*(uint *)((long)pHVar12 + lVar11 + 8);
LAB_004d6921:
          *(undefined4 *)((long)pHVar12 + uVar8 * 0x20 + 0xc) =
               *(undefined4 *)((long)pHVar12 + lVar11 + 0xc);
          *(undefined4 *)((long)(this->field_0).head + lVar11 + 0xc) = 1;
          uVar9 = (ulong)*(uint *)((long)(this->field_0).head + uVar8 * 0x20 + 8);
          if (uVar9 != 0) {
            *(undefined4 *)((long)(this->field_0).head + uVar9 * 0x20 + 0xc) = 1;
          }
          rotateLeft(this,x);
          break;
        }
        uVar16 = (ulong)*(uint *)(lVar7 + 8);
        if ((uVar16 != 0) && (*(int *)((long)pHVar12 + uVar16 * 0x20 + 0xc) != 1)) {
LAB_004d68df:
          if (*(int *)((long)pHVar12 + uVar16 * 0x20 + 0xc) == 1) {
            if (uVar14 != 0) goto LAB_004d68f2;
            goto LAB_004d6901;
          }
          goto LAB_004d6921;
        }
LAB_004d6821:
        *(undefined4 *)(lVar7 + 0xc) = 0;
        pHVar12 = (this->field_0).head;
        lVar7 = (long)pHVar12 + lVar11;
        uVar8 = (ulong)*(uint *)((long)pHVar12 + lVar11);
        uVar13 = uVar9;
      } while (*(uint *)((long)pHVar12 + lVar11) != 0);
    }
    if ((int)uVar13 != 0) {
      pHVar12 = (this->field_0).head;
LAB_004d6966:
      *(undefined4 *)((long)pHVar12 + uVar13 * 0x20 + 0xc) = 1;
    }
  }
  return uVar6;
}

Assistant:

uint QFragmentMapData<Fragment>::erase_single(uint z)
{
    uint w = previous(z);
    uint y = z;
    uint x;
    uint p;

    if (!F(y).left) {
        x = F(y).right;
    } else if (!F(y).right) {
        x = F(y).left;
    } else {
        y = F(y).right;
        while (F(y).left)
            y = F(y).left;
        x = F(y).right;
    }

    if (y != z) {
        F(F(z).left).parent = y;
        F(y).left = F(z).left;
        for (uint field = 0; field < Fragment::size_array_max; ++field)
            F(y).size_left_array[field] = F(z).size_left_array[field];
        if (y != F(z).right) {
            /*
                     z                y
                    / \              / \
                   a   b            a   b
                      /                /
                    ...     -->      ...
                    /                /
                   y                x
                  / \
                 0   x
             */
            p = F(y).parent;
            if (x)
                F(x).parent = p;
            F(p).left = x;
            F(y).right = F(z).right;
            F(F(z).right).parent = y;
            uint n = p;
            while (n != y) {
                for (uint field = 0; field < Fragment::size_array_max; ++field)
                    F(n).size_left_array[field] -= F(y).size_array[field];
                n = F(n).parent;
            }
        } else {
            /*
                     z                y
                    / \              / \
                   a   y     -->    a   x
                      / \
                     0   x
             */
            p = y;
        }
        uint zp = F(z).parent;
        if (!zp) {
            Q_ASSERT(head->root == z);
            head->root = y;
        } else if (F(zp).left == z) {
            F(zp).left = y;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(zp).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(zp).right = y;
        }
        F(y).parent = zp;
        // Swap the colors
        uint c = F(y).color;
        F(y).color = F(z).color;
        F(z).color = c;
        y = z;
    } else {
        /*
                p          p            p          p
               /          /              \          \
              z    -->   x                z  -->     x
              |                           |
              x                           x
         */
        p = F(z).parent;
        if (x)
            F(x).parent = p;
        if (!p) {
            Q_ASSERT(head->root == z);
            head->root = x;
        } else if (F(p).left == z) {
            F(p).left = x;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(p).right = x;
        }
    }
    uint n = z;
    while (F(n).parent) {
        uint p = F(n).parent;
        if (F(p).left == n) {
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        }
        n = p;
    }

    freeFragment(z);


    if (F(y).color != Red) {
        while (F(x).parent && (x == 0 || F(x).color == Black)) {
            if (x == F(p).left) {
                uint w = F(p).right;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateLeft(p);
                    w = F(p).right;
                }
                if ((F(w).left == 0 || F(F(w).left).color == Black) &&
                    (F(w).right == 0 || F(F(w).right).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).right == 0 || F(F(w).right).color == Black) {
                        if (F(w).left)
                            F(F(w).left).color = Black;
                        F(w).color = Red;
                        rotateRight(F(p).right);
                        w = F(p).right;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).right)
                        F(F(w).right).color = Black;
                    rotateLeft(p);
                    break;
                }
            } else {
                uint w = F(p).left;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateRight(p);
                    w = F(p).left;
                }
                if ((F(w).right == 0 || F(F(w).right).color == Black) &&
                    (F(w).left == 0 || F(F(w).left).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).left == 0 || F(F(w).left).color == Black) {
                        if (F(w).right)
                            F(F(w).right).color = Black;
                        F(w).color = Red;
                        rotateLeft(F(p).left);
                        w = F(p).left;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).left)
                        F(F(w).left).color = Black;
                    rotateRight(p);
                    break;
                }
            }
        }
        if (x)
            F(x).color = Black;
    }

    return w;
}